

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_12ce01::readWholeFiles(int modification)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  char *fileName;
  bool bVar4;
  __type _Var5;
  bool ytc;
  bool ytc_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Header *this;
  Box2i *pBVar13;
  Box2i *pBVar14;
  float *pfVar15;
  V2f *pVVar16;
  V2f *pVVar17;
  LineOrder *pLVar18;
  Compression *pCVar19;
  ChannelList *this_00;
  ChannelList *other;
  string *psVar20;
  string *psVar21;
  ostream *poVar22;
  long lVar23;
  ulong uVar24;
  undefined1 in_R10B;
  int iVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  DeepScanLineInputPart part_1;
  Array2D<unsigned_int> sampleCount;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  MultiPartInputFile file;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  InputPart part;
  
  fileName = (anonymous_namespace)::filename_abi_cxx11_;
  uData._sizeX = 0;
  uData._sizeY = 0;
  uData._data = (uint *)0x0;
  fData._sizeX = 0;
  fData._sizeY = 0;
  fData._data = (float *)0x0;
  hData._sizeX = 0;
  hData._sizeY = 0;
  hData._data = (half *)0x0;
  deepUData._sizeX = 0;
  deepUData._sizeY = 0;
  deepUData._data = (uint **)0x0;
  deepFData._sizeX = 0;
  deepFData._sizeY = 0;
  deepFData._data = (float **)0x0;
  deepHData._sizeX = 0;
  deepHData._sizeY = 0;
  deepHData._data = (half **)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  iVar6 = Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartInputFile::MultiPartInputFile(&file,fileName,iVar6,true);
  lVar23 = 0;
  lVar28 = 0;
  while( true ) {
    iVar6 = Imf_2_5::MultiPartInputFile::parts(&file);
    if (iVar6 <= lVar28) {
      std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::flush();
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (frameBuffer._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
          (int)frameBuffer._map._M_t._M_impl._0_4_ <
          (int)((DAT_00423878 - (long)(anonymous_namespace)::headers) / 0x38);
          frameBuffer._map._M_t._M_impl._0_4_ = frameBuffer._map._M_t._M_impl._0_4_ + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&shuffledPartNumber,(value_type_conflict3 *)&frameBuffer);
      }
      for (uVar26 = 0;
          uVar24 = (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2, uVar26 < uVar24; uVar26 = uVar26 + 1
          ) {
        iVar7 = random_int((int)uVar24);
        iVar8 = random_int((int)((ulong)((long)shuffledPartNumber.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)shuffledPartNumber.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2));
        iVar6 = shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] =
             shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar8];
        shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = iVar6;
      }
      uVar26 = 0;
      do {
        if ((ulong)((long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar26) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>);
          Imf_2_5::MultiPartInputFile::~MultiPartInputFile(&file);
          Imf_2_5::Array2D<unsigned_int>::~Array2D(&sampleCount);
          Imf_2_5::Array2D<half_*>::~Array2D(&deepHData);
          Imf_2_5::Array2D<float_*>::~Array2D(&deepFData);
          Imf_2_5::Array2D<unsigned_int_*>::~Array2D(&deepUData);
          Imf_2_5::Array2D<half>::~Array2D(&hData);
          Imf_2_5::Array2D<float>::~Array2D(&fData);
          Imf_2_5::Array2D<unsigned_int>::~Array2D(&uData);
          return;
        }
        iVar6 = shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar26];
        lVar23 = (long)iVar6;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar23 * 4)) {
        case 0:
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          setInputFrameBuffer(&frameBuffer,*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                              &uData,&fData,&hData,0x10,0x10);
          Imf_2_5::InputPart::InputPart(&part,&file,iVar6);
          Imf_2_5::InputPart::setFrameBuffer(&part,&frameBuffer);
          Imf_2_5::InputPart::readPixels(&part,0,0xf);
          iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
          if (iVar7 == 0) {
            bVar4 = checkPixels<unsigned_int>(&uData,0x10,0x10);
            if (!bVar4) {
              __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar4 = checkPixels<float>(&fData,0x10,0x10);
            if (!bVar4) {
              __assert_fail("checkPixels<float>(fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) && (bVar4 = checkPixels<half>(&hData,0x10,0x10), !bVar4)) {
            __assert_fail("checkPixels<half>(hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&frameBuffer);
          break;
        case 1:
          Imf_2_5::TiledInputPart::TiledInputPart((TiledInputPart *)&part,&file,iVar6);
          iVar8 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&part);
          iVar7 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&part);
          iVar27 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          for (; iVar27 != iVar8; iVar27 = iVar27 + 1) {
            for (iVar25 = 0; iVar7 != iVar25; iVar25 = iVar25 + 1) {
              bVar4 = Imf_2_5::TiledInputPart::isValidLevel((TiledInputPart *)&part,iVar27,iVar25);
              if (bVar4) {
                iVar9 = Imf_2_5::TiledInputPart::levelWidth((TiledInputPart *)&part,iVar27);
                iVar10 = Imf_2_5::TiledInputPart::levelHeight((TiledInputPart *)&part,iVar25);
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                setInputFrameBuffer(&frameBuffer,
                                    *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&uData,
                                    &fData,&hData,iVar9,iVar10);
                Imf_2_5::TiledInputPart::setFrameBuffer((TiledInputPart *)&part,&frameBuffer);
                iVar11 = Imf_2_5::TiledInputPart::numXTiles((TiledInputPart *)&part,iVar27);
                iVar12 = Imf_2_5::TiledInputPart::numYTiles((TiledInputPart *)&part,iVar25);
                Imf_2_5::TiledInputPart::readTiles
                          ((TiledInputPart *)&part,0,iVar11 + -1,0,iVar12 + -1,iVar27,iVar25);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
                if (iVar11 == 0) {
                  bVar4 = checkPixels<unsigned_int>(&uData,iVar9,iVar10);
                  if (!bVar4) {
                    __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x350,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar11 == 1) {
                  bVar4 = checkPixels<float>(&fData,iVar9,iVar10);
                  if (!bVar4) {
                    __assert_fail("checkPixels<float>(fData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x353,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar11 == 2) && (bVar4 = checkPixels<half>(&hData,iVar9,iVar10), !bVar4))
                {
                  __assert_fail("checkPixels<half>(hData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                ,0x356,"void (anonymous namespace)::readWholeFiles(int)");
                }
                std::
                _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                             *)&frameBuffer);
              }
            }
          }
          break;
        case 2:
          Imf_2_5::DeepScanLineInputPart::DeepScanLineInputPart(&part_1,&file,iVar6);
          Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
          Imf_2_5::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10,0x10);
          Imf_2_5::Slice::Slice
                    ((Slice *)&part,UINT,(char *)sampleCount._data,4,0x40,1,1,0.0,(bool)in_R10B,ytc)
          ;
          Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                    ((DeepFrameBuffer *)&frameBuffer,(Slice *)&part);
          setInputDeepFrameBuffer
                    ((DeepFrameBuffer *)&frameBuffer,
                     *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&deepUData,&deepFData,
                     &deepHData,0x10,0x10);
          Imf_2_5::DeepScanLineInputPart::setFrameBuffer(&part_1,(DeepFrameBuffer *)&frameBuffer);
          Imf_2_5::DeepScanLineInputPart::readPixelSampleCounts(&part_1,0,0xf);
          allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&sampleCount,
                         &deepUData,&deepFData,&deepHData,0x10,0x10);
          Imf_2_5::DeepScanLineInputPart::readPixels(&part_1,0,0xf);
          iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
          if (iVar7 == 0) {
            bVar4 = checkPixels<unsigned_int>(&sampleCount,&deepUData,0x10,0x10);
            if (!bVar4) {
              __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x376,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar4 = checkPixels<float>(&sampleCount,&deepFData,0x10,0x10);
            if (!bVar4) {
              __assert_fail("checkPixels<float>(sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x379,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) &&
                  (bVar4 = checkPixels<half>(&sampleCount,&deepHData,0x10,0x10), !bVar4)) {
            __assert_fail("checkPixels<half>(sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x37c,"void (anonymous namespace)::readWholeFiles(int)");
          }
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&deepUData,
                        &deepFData,&deepHData,0x10,0x10);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                       *)&frameBuffer);
          break;
        case 3:
          Imf_2_5::DeepTiledInputPart::DeepTiledInputPart((DeepTiledInputPart *)&part_1,&file,iVar6)
          ;
          iVar8 = Imf_2_5::DeepTiledInputPart::numXLevels((DeepTiledInputPart *)&part_1);
          iVar7 = Imf_2_5::DeepTiledInputPart::numYLevels((DeepTiledInputPart *)&part_1);
          iVar27 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          for (; iVar27 != iVar8; iVar27 = iVar27 + 1) {
            for (iVar25 = 0; iVar7 != iVar25; iVar25 = iVar25 + 1) {
              bVar4 = Imf_2_5::DeepTiledInputPart::isValidLevel
                                ((DeepTiledInputPart *)&part_1,iVar27,iVar25);
              if (bVar4) {
                iVar9 = Imf_2_5::DeepTiledInputPart::levelWidth
                                  ((DeepTiledInputPart *)&part_1,iVar27);
                iVar10 = Imf_2_5::DeepTiledInputPart::levelHeight
                                   ((DeepTiledInputPart *)&part_1,iVar25);
                Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
                Imf_2_5::Array2D<unsigned_int>::resizeErase(&sampleCount,(long)iVar10,(long)iVar9);
                Imf_2_5::Slice::Slice
                          ((Slice *)&part,UINT,(char *)sampleCount._data,4,(long)iVar9 << 2,1,1,0.0,
                           (bool)in_R10B,ytc_00);
                Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                          ((DeepFrameBuffer *)&frameBuffer,(Slice *)&part);
                setInputDeepFrameBuffer
                          ((DeepFrameBuffer *)&frameBuffer,
                           *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&deepUData,
                           &deepFData,&deepHData,iVar9,iVar10);
                Imf_2_5::DeepTiledInputPart::setFrameBuffer
                          ((DeepTiledInputPart *)&part_1,(DeepFrameBuffer *)&frameBuffer);
                iVar11 = Imf_2_5::DeepTiledInputPart::numXTiles
                                   ((DeepTiledInputPart *)&part_1,iVar27);
                iVar12 = Imf_2_5::DeepTiledInputPart::numYTiles
                                   ((DeepTiledInputPart *)&part_1,iVar25);
                Imf_2_5::DeepTiledInputPart::readPixelSampleCounts
                          ((DeepTiledInputPart *)&part_1,0,iVar11 + -1,0,iVar12 + -1,iVar27,iVar25);
                allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&sampleCount
                               ,&deepUData,&deepFData,&deepHData,iVar9,iVar10);
                Imf_2_5::DeepTiledInputPart::readTiles
                          ((DeepTiledInputPart *)&part_1,0,iVar11 + -1,0,iVar12 + -1,iVar27,iVar25);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
                if (iVar11 == 0) {
                  bVar4 = checkPixels<unsigned_int>(&sampleCount,&deepUData,iVar9,iVar10);
                  if (!bVar4) {
                    __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x3ad,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar11 == 1) {
                  bVar4 = checkPixels<float>(&sampleCount,&deepFData,iVar9,iVar10);
                  if (!bVar4) {
                    __assert_fail("checkPixels<float>(sampleCount, deepFData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x3b0,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar11 == 2) &&
                        (bVar4 = checkPixels<half>(&sampleCount,&deepHData,iVar9,iVar10), !bVar4)) {
                  __assert_fail("checkPixels<half>(sampleCount, deepHData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                ,0x3b3,"void (anonymous namespace)::readWholeFiles(int)");
                }
                releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),&deepUData,
                              &deepFData,&deepHData,iVar9,iVar10);
                std::
                _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                             *)&frameBuffer);
              }
            }
          }
        }
        poVar22 = std::operator<<((ostream *)&std::cerr,"part ");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar6);
        std::operator<<(poVar22," ok ");
        uVar26 = uVar26 + 1;
      } while( true );
    }
    this = Imf_2_5::MultiPartInputFile::header(&file,(int)lVar28);
    pBVar13 = Imf_2_5::Header::displayWindow(this);
    pBVar14 = Imf_2_5::Header::displayWindow
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar4) {
      __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f0,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pBVar13 = Imf_2_5::Header::dataWindow(this);
    pBVar14 = Imf_2_5::Header::dataWindow
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar4) {
      __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f1,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar15 = Imf_2_5::Header::pixelAspectRatio(this);
    fVar1 = *pfVar15;
    pfVar15 = Imf_2_5::Header::pixelAspectRatio
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f2,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pVVar16 = Imf_2_5::Header::screenWindowCenter(this);
    pVVar17 = Imf_2_5::Header::screenWindowCenter
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    if ((((pVVar16->x != pVVar17->x) || (NAN(pVVar16->x) || NAN(pVVar17->x))) ||
        (pVVar16->y != pVVar17->y)) || (NAN(pVVar16->y) || NAN(pVVar17->y))) break;
    pfVar15 = Imf_2_5::Header::screenWindowWidth(this);
    fVar1 = *pfVar15;
    pfVar15 = Imf_2_5::Header::screenWindowWidth
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f4,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pLVar18 = Imf_2_5::Header::lineOrder(this);
    LVar2 = *pLVar18;
    pLVar18 = Imf_2_5::Header::lineOrder
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    if (LVar2 != *pLVar18) {
      __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f5,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pCVar19 = Imf_2_5::Header::compression(this);
    CVar3 = *pCVar19;
    pCVar19 = Imf_2_5::Header::compression
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    if (CVar3 != *pCVar19) {
      __assert_fail("header.compression() == headers[i].compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f6,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this_00 = Imf_2_5::Header::channels(this);
    other = Imf_2_5::Header::channels
                      ((Header *)
                       (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    bVar4 = Imf_2_5::ChannelList::operator==(this_00,other);
    if (!bVar4) {
      __assert_fail("header.channels() == headers[i].channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f7,"void (anonymous namespace)::readWholeFiles(int)");
    }
    psVar20 = Imf_2_5::Header::name_abi_cxx11_(this);
    psVar21 = Imf_2_5::Header::name_abi_cxx11_
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23));
    _Var5 = std::operator==(psVar20,psVar21);
    if (!_Var5) {
      __assert_fail("header.name() == headers[i].name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f8,"void (anonymous namespace)::readWholeFiles(int)");
    }
    if (lVar28 == 0 && modification == 1) {
      psVar20 = Imf_2_5::Header::type_abi_cxx11_(this);
      psVar21 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
      bVar4 = std::operator!=(psVar20,psVar21);
      if (!bVar4) {
        __assert_fail("header.type() != headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fb,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      psVar20 = Imf_2_5::Header::type_abi_cxx11_(this);
      psVar21 = Imf_2_5::Header::type_abi_cxx11_
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar23)
                          );
      _Var5 = std::operator==(psVar20,psVar21);
      if (!_Var5) {
        __assert_fail("header.type() == headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fd,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar28 = lVar28 + 1;
    lVar23 = lVar23 + 0x38;
  }
  __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                ,0x2f3,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file(filename.c_str());
    for (int i = 0; i < file.parts(); i++)
    {
        const Header& header = file.header(i);
        assert (header.displayWindow() == headers[i].displayWindow());
        assert (header.dataWindow() == headers[i].dataWindow());
        assert (header.pixelAspectRatio() == headers[i].pixelAspectRatio());
        assert (header.screenWindowCenter() == headers[i].screenWindowCenter());
        assert (header.screenWindowWidth() == headers[i].screenWindowWidth());
        assert (header.lineOrder() == headers[i].lineOrder());
        assert (header.compression() == headers[i].compression());
        assert (header.channels() == headers[i].channels());
        assert (header.name() == headers[i].name());
        if(modification==1 && i==0)
        {
            assert (header.type() != headers[i].type());
        }else{
            assert (header.type() == headers[i].type());
        }
    }

    cout << "Reading whole files " << flush;

    
    
    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification>0 ? 1 : 0; i < static_cast<int>(headers.size()); i++)
        shuffledPartNumber.push_back(i);
    for (size_t i = 0; i < shuffledPartNumber.size(); i++)
    {
        size_t a = random_int(shuffledPartNumber.size());
        size_t b = random_int(shuffledPartNumber.size());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }


   

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size(); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0:
                {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                        uData, fData, hData, width, height);

                    InputPart part(file, partNumber);
                    part.setFrameBuffer(frameBuffer);
                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(uData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(fData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(hData, width, height));
                            break;
                    }
                    break;
                }
                case 1:
                {
                    TiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                uData, fData, hData, w, h);

                            part.setFrameBuffer(frameBuffer);
                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);
                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(uData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(fData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2:
                {
                    DeepScanLineInputPart part(file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase(height, width);
                    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                        (char *) (&sampleCount[0][0]),
                                                        sizeof (unsigned int) * 1,
                                                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                            deepUData, deepFData, deepHData, width, height);

                    part.setFrameBuffer(frameBuffer);

                    part.readPixelSampleCounts(0, height - 1);

                    allocatePixels(pixelTypes[partNumber], sampleCount,
                                   deepUData, deepFData, deepHData, width, height);

                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels(pixelTypes[partNumber],
                                  deepUData, deepFData, deepHData, width, height);

                    break;
                }
                case 3:
                {
                    DeepTiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase(h, w);
                            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                                (char *) (&sampleCount[0][0]),
                                                                sizeof (unsigned int) * 1,
                                                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                    deepUData, deepFData, deepHData, w, h);

                            part.setFrameBuffer(frameBuffer);

                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);

                            part.readPixelSampleCounts(0, numXTiles - 1, 0, numYTiles - 1,
                                                       xLevel, yLevel);

                            allocatePixels(pixelTypes[partNumber], sampleCount,
                                           deepUData, deepFData, deepHData, w, h);

                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels(pixelTypes[partNumber],
                                          deepUData, deepFData, deepHData, w, h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
            
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}